

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O2

bool cmCreateTestSourceList
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  char *__s;
  cmMakefile *this;
  size_type sVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  string *psVar6;
  string *psVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  cmSourceFile *pcVar9;
  string *psVar10;
  pointer pbVar11;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string sourceListValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string configFile;
  cmNewLineStyle local_194;
  string functionMapCode;
  string forwardDeclareCode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string local_f0;
  string function;
  string extraInclude;
  string local_90;
  string driver;
  string local_50;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar5 - (long)pbVar11) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configFile,"called with wrong number of arguments.",
               (allocator<char> *)&forwardDeclareCode);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&configFile);
    bVar3 = false;
  }
  else {
    extraInclude._M_dataplus._M_p = (pointer)&extraInclude.field_2;
    extraInclude._M_string_length = 0;
    extraInclude.field_2._M_local_buf[0] = '\0';
    function._M_dataplus._M_p = (pointer)&function.field_2;
    function._M_string_length = 0;
    function.field_2._M_local_buf[0] = '\0';
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (; pbVar2 = tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, pbVar11 != pbVar5;
        pbVar11 = pbVar11 + 1) {
      bVar3 = std::operator==(pbVar11,"EXTRA_INCLUDE");
      if (bVar3) {
        if (pbVar11 + 1 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&configFile,"incorrect arguments to EXTRA_INCLUDE",
                     (allocator<char> *)&forwardDeclareCode);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00212216;
        }
        configFile._M_dataplus._M_p = (pointer)0xa;
        configFile._M_string_length = (long)"!\nConsider to\n  - add #include \"" + 0x16;
        forwardDeclareCode._M_string_length = (size_type)pbVar11[1]._M_dataplus._M_p;
        forwardDeclareCode._M_dataplus._M_p = (pointer)pbVar11[1]._M_string_length;
        cmStrCat<char[3]>(&driver,(cmAlphaNum *)&configFile,(cmAlphaNum *)&forwardDeclareCode,
                          (char (*) [3])0x5c4c35);
        psVar7 = &extraInclude;
LAB_00211a31:
        pbVar11 = pbVar11 + 1;
        std::__cxx11::string::operator=((string *)psVar7,(string *)&driver);
        std::__cxx11::string::~string((string *)&driver);
      }
      else {
        bVar3 = std::operator==(pbVar11,"FUNCTION");
        if (bVar3) {
          if (pbVar11 + 1 !=
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            configFile._M_string_length = (size_type)pbVar11[1]._M_dataplus._M_p;
            configFile._M_dataplus._M_p = (pointer)pbVar11[1]._M_string_length;
            forwardDeclareCode._M_dataplus._M_p = (pointer)0xc;
            forwardDeclareCode._M_string_length = (size_type)anon_var_dwarf_5aa6e1;
            cmStrCat<>(&driver,(cmAlphaNum *)&configFile,(cmAlphaNum *)&forwardDeclareCode);
            psVar7 = &function;
            goto LAB_00211a31;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&configFile,"incorrect arguments to FUNCTION",
                     (allocator<char> *)&forwardDeclareCode);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00212216;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tests,pbVar11);
      }
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    __s = ((tests.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    psVar7 = tests.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    cmsys::SystemTools::GetFilenameExtension(&configFile,psVar7);
    sVar1 = configFile._M_string_length;
    std::__cxx11::string::~string((string *)&configFile);
    if (sVar1 < 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configFile,"You must specify a file extension for the test driver file."
                 ,(allocator<char> *)&forwardDeclareCode);
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00212216:
      std::__cxx11::string::~string((string *)&configFile);
      bVar3 = false;
    }
    else {
      this = status->Makefile;
      psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      configFile._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
      configFile._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
      forwardDeclareCode._M_dataplus._M_p = (pointer)0x1;
      forwardDeclareCode.field_2._M_local_buf[0] = '/';
      forwardDeclareCode._M_string_length = (size_type)&forwardDeclareCode.field_2;
      cmStrCat<std::__cxx11::string>
                (&driver,(cmAlphaNum *)&configFile,(cmAlphaNum *)&forwardDeclareCode,psVar7);
      psVar7 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      std::__cxx11::string::string((string *)&configFile,(string *)psVar7);
      std::__cxx11::string::append((char *)&configFile);
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      forwardDeclareCode._M_string_length = 0;
      forwardDeclareCode.field_2._M_local_buf[0] = '\0';
      psVar6 = pbVar2 + 2;
      forwardDeclareCode._M_dataplus._M_p = (pointer)&forwardDeclareCode.field_2;
      for (psVar7 = psVar6;
          psVar7 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1) {
        bVar3 = std::operator==(psVar7,"EXTRA_INCLUDE");
        if (bVar3) break;
        functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
        functionMapCode._M_string_length = 0;
        functionMapCode.field_2._M_local_buf[0] = '\0';
        cmsys::SystemTools::GetFilenamePath(&sourceListValue,psVar7);
        sVar1 = sourceListValue._M_string_length;
        std::__cxx11::string::~string((string *)&sourceListValue);
        if (sVar1 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&sourceListValue,psVar7);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          psVar10 = &sourceListValue;
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_f0,psVar7);
          std::operator+(&local_1f0,&local_f0,"/");
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_90,psVar7);
          std::operator+(&sourceListValue,&local_1f0,&local_90);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          std::__cxx11::string::~string((string *)&sourceListValue);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_1f0);
          psVar10 = &local_f0;
        }
        std::__cxx11::string::~string((string *)psVar10);
        cmsys::SystemTools::ConvertToUnixSlashes(&functionMapCode);
        cmsys::SystemTools::MakeCidentifier(&sourceListValue,&functionMapCode);
        std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
        std::__cxx11::string::~string((string *)&sourceListValue);
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (tests_func_name.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           tests_func_name.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&functionMapCode);
        pbVar11 = tests_func_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tests_func_name,&functionMapCode);
        if (_Var8._M_current == pbVar11) {
          std::__cxx11::string::append((char *)&forwardDeclareCode);
          std::__cxx11::string::append((string *)&forwardDeclareCode);
          std::__cxx11::string::append((char *)&forwardDeclareCode);
        }
        std::__cxx11::string::~string((string *)&functionMapCode);
      }
      functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
      functionMapCode._M_string_length = 0;
      functionMapCode.field_2._M_local_buf[0] = '\0';
      for (psVar7 = psVar6;
          psVar7 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        sourceListValue._M_string_length = 0;
        sourceListValue.field_2._M_local_buf[0] = '\0';
        psVar10 = &local_1f0;
        cmsys::SystemTools::GetFilenamePath(psVar10,psVar7);
        sVar1 = local_1f0._M_string_length;
        std::__cxx11::string::~string((string *)psVar10);
        if (sVar1 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(psVar10,psVar7);
          std::__cxx11::string::operator=((string *)&sourceListValue,(string *)psVar10);
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_90,psVar7);
          std::operator+(&local_f0,&local_90,"/");
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_50,psVar7);
          std::operator+(&local_1f0,&local_f0,&local_50);
          std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_f0);
          psVar10 = &local_90;
        }
        std::__cxx11::string::~string((string *)psVar10);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::append((string *)&functionMapCode);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::append((string *)&functionMapCode);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      if (extraInclude._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                   (allocator<char> *)&local_1f0);
        value._M_str = extraInclude._M_dataplus._M_p;
        value._M_len = extraInclude._M_string_length;
        cmMakefile::AddDefinition(this,&sourceListValue,value);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      if (function._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                   (allocator<char> *)&local_1f0);
        value_00._M_str = function._M_dataplus._M_p;
        value_00._M_len = function._M_string_length;
        cmMakefile::AddDefinition(this,&sourceListValue,value_00);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceListValue,"CMAKE_FORWARD_DECLARE_TESTS",
                 (allocator<char> *)&local_1f0);
      value_01._M_str = forwardDeclareCode._M_dataplus._M_p;
      value_01._M_len = forwardDeclareCode._M_string_length;
      cmMakefile::AddDefinition(this,&sourceListValue,value_01);
      std::__cxx11::string::~string((string *)&sourceListValue);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceListValue,"CMAKE_FUNCTION_TABLE_ENTRIES",
                 (allocator<char> *)&local_1f0);
      value_02._M_str = functionMapCode._M_dataplus._M_p;
      value_02._M_len = functionMapCode._M_string_length;
      cmMakefile::AddDefinition(this,&sourceListValue,value_02);
      std::__cxx11::string::~string((string *)&sourceListValue);
      cmNewLineStyle::cmNewLineStyle(&local_194);
      iVar4 = cmMakefile::ConfigureFile(this,&configFile,&driver,false,true,false,0,local_194);
      bVar3 = iVar4 != 0;
      sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
      sourceListValue._M_string_length = 0;
      sourceListValue.field_2._M_local_buf[0] = '\0';
      pcVar9 = cmMakefile::GetOrCreateSource(this,&driver,false,Ambiguous);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"ABSTRACT",(allocator<char> *)&local_f0);
      cmSourceFile::SetProperty(pcVar9,&local_1f0,"0");
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::_M_assign((string *)&sourceListValue);
      for (; psVar6 != tests.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; psVar6 = psVar6 + 1) {
        pcVar9 = cmMakefile::GetOrCreateSource(this,psVar6,false,Ambiguous);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"ABSTRACT",(allocator<char> *)&local_f0);
        cmSourceFile::SetProperty(pcVar9,&local_1f0,"0");
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::append((char *)&sourceListValue);
        std::__cxx11::string::append((string *)&sourceListValue);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,__s,(allocator<char> *)&local_f0);
      value_03._M_str = sourceListValue._M_dataplus._M_p;
      value_03._M_len = sourceListValue._M_string_length;
      cmMakefile::AddDefinition(this,&local_1f0,value_03);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&sourceListValue);
      std::__cxx11::string::~string((string *)&functionMapCode);
      std::__cxx11::string::~string((string *)&forwardDeclareCode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tests_func_name);
      std::__cxx11::string::~string((string *)&configFile);
      std::__cxx11::string::~string((string *)&driver);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tests);
    std::__cxx11::string::~string((string *)&function);
    std::__cxx11::string::~string((string *)&extraInclude);
  }
  return bVar3;
}

Assistant:

bool cmCreateTestSourceList(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with wrong number of arguments.");
    return false;
  }

  auto i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for (; i != args.end(); i++) {
    if (*i == "EXTRA_INCLUDE") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
      }
      extraInclude = cmStrCat("#include \"", *i, "\"\n");
    } else if (*i == "FUNCTION") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to FUNCTION");
        return false;
      }
      function = cmStrCat(*i, "(&ac, &av);\n");
    } else {
      tests.push_back(*i);
    }
  }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2) {
    status.SetError(
      "You must specify a file extension for the test driver file.");
    return false;
  }
  cmMakefile& mf = status.GetMakefile();
  std::string driver = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', *i);
  ++i;

  std::string configFile = cmSystemTools::GetCMakeRoot();

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  auto testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for (i = testsBegin; i != tests.end(); ++i) {
    if (*i == "EXTRA_INCLUDE") {
      break;
    }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    func_name = cmSystemTools::MakeCidentifier(func_name);
    bool already_declared =
      std::find(tests_func_name.begin(), tests_func_name.end(), func_name) !=
      tests_func_name.end();
    tests_func_name.push_back(func_name);
    if (!already_declared) {
      forwardDeclareCode += "int ";
      forwardDeclareCode += func_name;
      forwardDeclareCode += "(int, char*[]);\n";
    }
  }

  std::string functionMapCode;
  std::vector<std::string>::iterator j;
  for (i = testsBegin, j = tests_func_name.begin(); i != tests.end();
       ++i, ++j) {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    functionMapCode += "  {\n"
                       "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
                       "    ";
    functionMapCode += *j;
    functionMapCode += "\n"
                       "  },\n";
  }
  if (!extraInclude.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES", extraInclude);
  }
  if (!function.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION", function);
  }
  mf.AddDefinition("CMAKE_FORWARD_DECLARE_TESTS", forwardDeclareCode);
  mf.AddDefinition("CMAKE_FUNCTION_TABLE_ENTRIES", functionMapCode);
  bool res = true;
  if (!mf.ConfigureFile(configFile, driver, false, true, false)) {
    res = false;
  }

  // Construct the source list.
  std::string sourceListValue;
  {
    cmSourceFile* sf = mf.GetOrCreateSource(driver);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue = args[1];
  }
  for (i = testsBegin; i != tests.end(); ++i) {
    cmSourceFile* sf = mf.GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue += ";";
    sourceListValue += *i;
  }

  mf.AddDefinition(sourceList, sourceListValue);
  return res;
}